

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

ostream * license::operator<<(ostream *out,EventRegistry *er)

{
  pointer paVar1;
  ostream *poVar2;
  anon_struct_1288_4_4db92441 *it;
  pointer paVar3;
  allocator local_51;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,"EventReg[step:",&local_51);
  poVar2 = std::operator<<(out,local_50);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,er->current_validation_step);
  std::operator<<(poVar2,",events:{");
  std::__cxx11::string::~string(local_50);
  paVar1 = (er->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar3 = (er->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
                super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    poVar2 = std::operator<<(out,"[ev:");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,paVar3->event_type);
    poVar2 = std::operator<<(poVar2,",sev:");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,paVar3->severity);
    poVar2 = std::operator<<(poVar2,"ref:");
    poVar2 = std::operator<<(poVar2,paVar3->license_reference);
    std::operator<<(poVar2,"]");
  }
  std::operator<<(out,"]");
  return out;
}

Assistant:

ostream &operator<<(std::ostream &out, const EventRegistry &er) {
	out << string("EventReg[step:") << er.current_validation_step << ",events:{";
	for (auto &it : er.logs) {
		out << "[ev:" << it.event_type << ",sev:" << it.severity << "ref:" << it.license_reference << "]";
	}
	out << "]";
	return out;
}